

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

bool __thiscall QPDF::checkLinearizationInternal(QPDF *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long *plVar3;
  long __val;
  int iVar4;
  int iVar5;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar6;
  const_reference pvVar7;
  unsigned_long uVar8;
  mapped_type *this_00;
  long lVar9;
  longlong __val_00;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  size_type sVar12;
  mapped_type *pmVar13;
  logic_error *this_01;
  pointer pQVar14;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var15;
  pointer this_02;
  ulong __n;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string_view msg_04;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> shared_idx_to_obj;
  long local_158;
  int npages;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  Members *local_128;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_120;
  string local_118;
  QPDFObjGen og;
  string local_d8;
  string local_b8;
  string local_98;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  string local_50;
  
  _Var15._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  pvVar6 = getAllPages(this);
  iVar5 = *(int *)((long)&(_Var15._M_head_impl)->linp + 8);
  pvVar7 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(pvVar6,0);
  iVar4 = QPDFObjectHandle::getObjectID(pvVar7);
  if (iVar5 != iVar4) {
    msg._M_str = "first page object (/O) mismatch";
    msg._M_len = 0x1f;
    linearizationWarning(this,msg);
  }
  shared_idx_to_obj._M_t._M_impl._0_8_ =
       (long)(pvVar6->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(pvVar6->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_start >> 4;
  local_120 = pvVar6;
  npages = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                     ((unsigned_long *)&shared_idx_to_obj);
  local_128 = _Var15._M_head_impl;
  if (*(int *)((long)&(_Var15._M_head_impl)->linp + 0x18) != npages) {
    msg_00._M_str = "page count (/N) mismatch";
    msg_00._M_len = 0x18;
    linearizationWarning(this,msg_00);
  }
  __n = 0;
  while( true ) {
    uVar8 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&npages);
    if (uVar8 <= __n) break;
    pvVar7 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_120,__n);
    og = QPDFObjectHandle::getObjGen(pvVar7);
    this_00 = std::
              map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::operator[](&((this->m)._M_t.
                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                            xref_table,&og);
    iVar5 = QPDFXRefEntry::getType(this_00);
    if (iVar5 == 2) {
      std::__cxx11::to_string(&local_118,__n);
      std::operator+(&local_148,"page dictionary for page ",&local_118);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &shared_idx_to_obj,&local_148," is compressed");
      msg_01._M_len._4_4_ = shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      msg_01._M_len._0_4_ = shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      msg_01._M_str = (char *)shared_idx_to_obj._M_t._M_impl._0_8_;
      linearizationWarning(this,msg_01);
      std::__cxx11::string::~string((string *)&shared_idx_to_obj);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_118);
    }
    __n = __n + 1;
  }
  plVar3 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar3 + 0x28))(plVar3,(local_128->linp).xref_zero_offset,0);
  do {
    plVar3 = *(long **)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar3 + 0x38))(plVar3,&shared_idx_to_obj,1);
    if (0x20 < (shared_idx_to_obj._M_t._M_impl._0_8_ & 0xff)) break;
  } while ((0x100002400U >> (shared_idx_to_obj._M_t._M_impl._0_8_ & 0x3f) & 1) != 0);
  plVar3 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  local_158 = -1;
  (**(code **)(*plVar3 + 0x28))(plVar3,0xffffffffffffffff,1);
  lVar9 = (**(code **)(**(long **)&(((this->m)._M_t.
                                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                     .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                   file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                      + 0x20))();
  _Var15._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (lVar9 != (_Var15._M_head_impl)->first_xref_item_offset) {
    std::__cxx11::to_string((string *)&og,(_Var15._M_head_impl)->first_xref_item_offset);
    std::operator+(&local_118,"space before first xref item (/T) mismatch (computed = ",
                   (string *)&og);
    std::operator+(&local_148,&local_118,"; file = ");
    __val_00 = (**(code **)(**(long **)&(((this->m)._M_t.
                                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                          .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                         _M_head_impl)->file).
                                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                           + 0x20))();
    std::__cxx11::to_string(&local_d8,__val_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shared_idx_to_obj,&local_148,&local_d8);
    msg_02._M_len._4_4_ = shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
    msg_02._M_len._0_4_ = shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    msg_02._M_str = (char *)shared_idx_to_obj._M_t._M_impl._0_8_;
    linearizationWarning(this,msg_02);
    std::__cxx11::string::~string((string *)&shared_idx_to_obj);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&og);
    _Var15._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  }
  if ((_Var15._M_head_impl)->uncompressed_after_compressed == true) {
    msg_03._M_str =
         "linearized file contains an uncompressed object after a compressed one in a cross-reference stream"
    ;
    msg_03._M_len = 0x62;
    linearizationWarning(this,msg_03);
    _Var15._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  }
  shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header;
  shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var11 = *(_Base_ptr *)((long)&((_Var15._M_head_impl)->xref_table)._M_t._M_impl + 0x18);
      (_Rb_tree_header *)p_Var11 !=
      (_Rb_tree_header *)((long)&((_Var15._M_head_impl)->xref_table)._M_t._M_impl + 8U);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    iVar5 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var11[1]._M_parent);
    if (iVar5 == 2) {
      iVar5 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&p_Var11[1]._M_parent);
      local_148._M_dataplus._M_p._0_4_ = p_Var11[1]._M_color;
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&shared_idx_to_obj,(key_type *)&local_148);
      *pmVar10 = iVar5;
    }
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  optimize_internal<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (this,&shared_idx_to_obj,false,(function<int_(QPDFObjectHandle_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  calculateLinearizationData<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (this,&shared_idx_to_obj);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&shared_idx_to_obj._M_t);
  _Var15._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  this_02 = *(pointer *)
             &((_Var15._M_head_impl)->part6).
              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>;
  pQVar14 = *(pointer *)((long)&(_Var15._M_head_impl)->part6 + 8);
  if (this_02 == pQVar14) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shared_idx_to_obj,"linearization part 6 unexpectedly empty",
               (allocator<char> *)&local_148);
    stopOnError(this,(string *)&shared_idx_to_obj);
    std::__cxx11::string::~string((string *)&shared_idx_to_obj);
    _Var15._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    this_02 = *(pointer *)
               &((_Var15._M_head_impl)->part6).
                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>;
    pQVar14 = *(pointer *)((long)&(_Var15._M_head_impl)->part6 + 8);
  }
  lVar9 = -1;
  while( true ) {
    if (this_02 == pQVar14) {
      __val = (local_128->linp).first_page_end;
      p_Var1 = &shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header;
      if (lVar9 < __val || __val < local_158) {
        std::__cxx11::to_string(&local_50,__val);
        std::operator+(&local_d8,"end of first page section (/E) mismatch: /E = ",&local_50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og,
                       &local_d8,"; computed = ");
        std::__cxx11::to_string(&local_98,local_158);
        std::operator+(&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og,
                       &local_98);
        std::operator+(&local_148,&local_118,"..");
        std::__cxx11::to_string(&local_b8,lVar9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &shared_idx_to_obj,&local_148,&local_b8);
        msg_04._M_len._4_4_ = shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
        msg_04._M_len._0_4_ =
             shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        msg_04._M_str = (char *)shared_idx_to_obj._M_t._M_impl._0_8_;
        linearizationWarning(this,msg_04);
        std::__cxx11::string::~string((string *)&shared_idx_to_obj);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&og);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_50);
      }
      pvVar6 = local_120;
      shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      checkHSharedObject(this,local_120,&shared_idx_to_obj);
      checkHPageOffset(this,pvVar6,&shared_idx_to_obj);
      checkHOutlines(this);
      bVar2 = ((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linearization_warnings;
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&shared_idx_to_obj._M_t);
      return (bool)(bVar2 ^ 1);
    }
    shared_idx_to_obj._M_t._M_impl._0_8_ = QPDFObjectHandle::getObjGen(this_02);
    sVar12 = std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::count(&((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                     (key_type *)&shared_idx_to_obj);
    if (sVar12 == 0) break;
    pmVar13 = std::
              map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
              ::operator[](&((this->m)._M_t.
                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache
                           ,(key_type *)&shared_idx_to_obj);
    if (local_158 <= pmVar13->end_before_space) {
      local_158 = pmVar13->end_before_space;
    }
    if (lVar9 <= pmVar13->end_after_space) {
      lVar9 = pmVar13->end_after_space;
    }
    this_02 = this_02 + 1;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"linearization part6 object not in cache");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool
QPDF::checkLinearizationInternal()
{
    // All comments referring to the PDF spec refer to the spec for version 1.4.

    // Check all values in linearization parameter dictionary

    LinParameters& p = m->linp;

    // L: file size in bytes -- checked by isLinearized

    // O: object number of first page
    std::vector<QPDFObjectHandle> const& pages = getAllPages();
    if (p.first_page_object != pages.at(0).getObjectID()) {
        QTC::TC("qpdf", "QPDF err /O mismatch");
        linearizationWarning("first page object (/O) mismatch");
    }

    // N: number of pages
    int npages = toI(pages.size());
    if (p.npages != npages) {
        // Not tested in the test suite
        linearizationWarning("page count (/N) mismatch");
    }

    for (size_t i = 0; i < toS(npages); ++i) {
        QPDFObjectHandle const& page = pages.at(i);
        QPDFObjGen og(page.getObjGen());
        if (m->xref_table[og].getType() == 2) {
            linearizationWarning(
                "page dictionary for page " + std::to_string(i) + " is compressed");
        }
    }

    // T: offset of whitespace character preceding xref entry for object 0
    m->file->seek(p.xref_zero_offset, SEEK_SET);
    while (true) {
        char ch;
        m->file->read(&ch, 1);
        if (!((ch == ' ') || (ch == '\r') || (ch == '\n'))) {
            m->file->seek(-1, SEEK_CUR);
            break;
        }
    }
    if (m->file->tell() != m->first_xref_item_offset) {
        QTC::TC("qpdf", "QPDF err /T mismatch");
        linearizationWarning(
            "space before first xref item (/T) mismatch (computed = " +
            std::to_string(m->first_xref_item_offset) +
            "; file = " + std::to_string(m->file->tell()));
    }

    // P: first page number -- Implementation note 124 says Acrobat ignores this value, so we will
    // too.

    // Check numbering of compressed objects in each xref section. For linearized files, all
    // compressed objects are supposed to be at the end of the containing xref section if any object
    // streams are in use.

    if (m->uncompressed_after_compressed) {
        linearizationWarning(
            "linearized file contains an uncompressed object after a compressed "
            "one in a cross-reference stream");
    }

    // Further checking requires optimization and order calculation. Don't allow optimization to
    // make changes.  If it has to, then the file is not properly linearized.  We use the xref table
    // to figure out which objects are compressed and which are uncompressed.
    { // local scope
        std::map<int, int> object_stream_data;
        for (auto const& iter: m->xref_table) {
            QPDFObjGen const& og = iter.first;
            QPDFXRefEntry const& entry = iter.second;
            if (entry.getType() == 2) {
                object_stream_data[og.getObj()] = entry.getObjStreamNumber();
            }
        }
        optimize_internal(object_stream_data, false, nullptr);
        calculateLinearizationData(object_stream_data);
    }

    // E: offset of end of first page -- Implementation note 123 says Acrobat includes on extra
    // object here by mistake.  pdlin fails to place thumbnail images in section 9, so when
    // thumbnails are present, it also gets the wrong value for /E.  It also doesn't count outlines
    // here when it should even though it places them in part 6.  This code fails to put thread
    // information dictionaries in part 9, so it actually gets the wrong value for E when threads
    // are present.  In that case, it would probably agree with pdlin.  As of this writing, the test
    // suite doesn't contain any files with threads.

    if (m->part6.empty()) {
        stopOnError("linearization part 6 unexpectedly empty");
    }
    qpdf_offset_t min_E = -1;
    qpdf_offset_t max_E = -1;
    for (auto const& oh: m->part6) {
        QPDFObjGen og(oh.getObjGen());
        if (m->obj_cache.count(og) == 0) {
            // All objects have to have been dereferenced to be classified.
            throw std::logic_error("linearization part6 object not in cache");
        }
        ObjCache const& oc = m->obj_cache[og];
        min_E = std::max(min_E, oc.end_before_space);
        max_E = std::max(max_E, oc.end_after_space);
    }
    if ((p.first_page_end < min_E) || (p.first_page_end > max_E)) {
        QTC::TC("qpdf", "QPDF warn /E mismatch");
        linearizationWarning(
            "end of first page section (/E) mismatch: /E = " + std::to_string(p.first_page_end) +
            "; computed = " + std::to_string(min_E) + ".." + std::to_string(max_E));
    }

    // Check hint tables

    std::map<int, int> shared_idx_to_obj;
    checkHSharedObject(pages, shared_idx_to_obj);
    checkHPageOffset(pages, shared_idx_to_obj);
    checkHOutlines();

    return !m->linearization_warnings;
}